

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void test_hash(ptls_hash_algorithm_t *hash)

{
  int iVar1;
  uint8_t digest [64];
  
  iVar1 = ptls_calc_hash(hash,digest,"",0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x40);
  iVar1 = bcmp(digest,hash->empty_digest,hash->digest_size);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x41);
  return;
}

Assistant:

static void test_hash(ptls_hash_algorithm_t *hash)
{
    uint8_t digest[PTLS_MAX_DIGEST_SIZE];
    int ret = ptls_calc_hash(hash, digest, "", 0);
    ok(ret == 0);
    ok(memcmp(digest, hash->empty_digest, hash->digest_size) == 0);
}